

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O1

shared_ptr<tf::TFProfObserver> __thiscall
tf::Executor::make_observer<tf::TFProfObserver>(Executor *this)

{
  undefined4 uVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _func_int **pp_Var4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  size_type __new_size;
  pair<std::__detail::_Node_iterator<std::shared_ptr<tf::ObserverInterface>,_true,_false>,_bool>
  pVar6;
  shared_ptr<tf::TFProfObserver> sVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  *(undefined8 *)this = 0;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0014ba58;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__TFProfObserver_0014bb08;
  p_Var3[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[2]._M_use_count = 0;
  p_Var3[2]._M_weak_count = 0;
  p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[3]._M_use_count = 0;
  p_Var3[3]._M_weak_count = 0;
  p_Var3[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[4]._M_use_count = 0;
  p_Var3[4]._M_weak_count = 0;
  p_Var3[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x8 = p_Var3;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this = p_Var3 + 1;
  __new_size = (*(long *)(in_RSI + 0xf0) - *(long *)(in_RSI + 0xe8) >> 7) * -0x5555555555555555;
  LOCK();
  UNLOCK();
  uVar1 = _ZZN2tf9unique_idImTnPNSt9enable_ifIXsr3stdE13is_integral_vIT_EEvE4typeELPv0EEES2_vE7counter
          ._4_4_;
  lVar2 = _ZZN2tf9unique_idImTnPNSt9enable_ifIXsr3stdE13is_integral_vIT_EEvE4typeELPv0EEES2_vE7counter
          + 1;
  p_Var3[1]._M_use_count =
       (undefined4)
       _ZZN2tf9unique_idImTnPNSt9enable_ifIXsr3stdE13is_integral_vIT_EEvE4typeELPv0EEES2_vE7counter;
  _ZZN2tf9unique_idImTnPNSt9enable_ifIXsr3stdE13is_integral_vIT_EEvE4typeELPv0EEES2_vE7counter =
       lVar2;
  p_Var3[1]._M_weak_count = uVar1;
  pp_Var4 = (_func_int **)std::chrono::_V2::steady_clock::now();
  p_Var3[2]._vptr__Sp_counted_base = pp_Var4;
  std::
  vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
            *)&p_Var3[2]._M_use_count,__new_size);
  std::
  vector<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_std::allocator<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>_>
  ::resize((vector<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>,_std::allocator<std::stack<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::deque<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>_>_>
            *)(p_Var3 + 4),__new_size);
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
  }
  local_38 = p_Var3 + 1;
  local_30 = p_Var3;
  pVar6 = std::
          _Hashtable<std::shared_ptr<tf::ObserverInterface>,std::shared_ptr<tf::ObserverInterface>,std::allocator<std::shared_ptr<tf::ObserverInterface>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<tf::ObserverInterface>>,std::hash<std::shared_ptr<tf::ObserverInterface>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<std::shared_ptr<tf::ObserverInterface>>
                    ((_Hashtable<std::shared_ptr<tf::ObserverInterface>,std::shared_ptr<tf::ObserverInterface>,std::allocator<std::shared_ptr<tf::ObserverInterface>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<tf::ObserverInterface>>,std::hash<std::shared_ptr<tf::ObserverInterface>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)(in_RSI + 0x298),&local_38);
  _Var5._M_pi = pVar6._8_8_;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    _Var5._M_pi = extraout_RDX;
  }
  sVar7.super___shared_ptr<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar7.super___shared_ptr<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<tf::TFProfObserver>)
         sVar7.super___shared_ptr<tf::TFProfObserver,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Observer> Executor::make_observer(ArgsT&&... args) {

  static_assert(
    std::is_base_of_v<ObserverInterface, Observer>,
    "Observer must be derived from ObserverInterface"
  );

  // use a local variable to mimic the constructor
  auto ptr = std::make_shared<Observer>(std::forward<ArgsT>(args)...);

  ptr->set_up(_workers.size());

  _observers.emplace(std::static_pointer_cast<ObserverInterface>(ptr));

  return ptr;
}